

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O1

Dim * __thiscall
cnn::Conv1DNarrow::dim_forward
          (Dim *__return_storage_ptr__,Conv1DNarrow *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  long lVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  uint uVar4;
  uint uVar5;
  uint local_18 [2];
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar1 == 0x48) {
    uVar5 = 1;
    uVar4 = 1;
    if (1 < pDVar1->nd) {
      uVar4 = pDVar1->d[1];
    }
    if (1 < pDVar1[1].nd) {
      uVar5 = pDVar1[1].d[1];
    }
    if ((((pDVar1->nd == 2) && (pDVar1[1].nd == 2)) &&
        (local_18[1] = (uVar4 - uVar5) + 1, local_18[1] != 0)) && (pDVar1->d[0] == pDVar1[1].d[0]))
    {
      local_18[0] = pDVar1->d[0];
      __return_storage_ptr__->nd = 0;
      __return_storage_ptr__->bd = 1;
      lVar2 = 0;
      do {
        uVar4 = *(uint *)((long)local_18 + lVar2);
        uVar5 = __return_storage_ptr__->nd;
        __return_storage_ptr__->nd = uVar5 + 1;
        __return_storage_ptr__->d[uVar5] = uVar4;
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad input dimensions in Conv1DNarrow: ",0x26);
    poVar3 = operator<<((ostream *)&std::cerr,xs);
    std::endl<char,std::char_traits<char>>(poVar3);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"bad input dimensions in Conv1DNarrow");
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Conv1DNarrow requires two inputs: ",0x22);
    poVar3 = operator<<((ostream *)&std::cerr,xs);
    std::endl<char,std::char_traits<char>>(poVar3);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Conv1DNarrow requires 2 dimensions");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Conv1DNarrow::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2) {
    cerr << "Conv1DNarrow requires two inputs: " << xs << endl;
    throw std::invalid_argument("Conv1DNarrow requires 2 dimensions");
  }
  unsigned ocols = xs[0].cols() - xs[1].cols() + 1;
  if (xs[0].ndims() != 2 || xs[1].ndims() != 2 ||
      xs[0].rows() != xs[1].rows() ||
      ocols < 1) {
    cerr << "Bad input dimensions in Conv1DNarrow: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in Conv1DNarrow");
  }
  return Dim({xs[0].rows(), ocols});
}